

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O1

void deqp::gls::setupDefaultUniforms(RenderContext *context,deUint32 programID)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  int arr [4];
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  long lVar2;
  
  iVar1 = (*context->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  lVar3 = 0;
  do {
    iVar1 = (**(code **)(lVar2 + 0xb48))
                      (programID,
                       *(undefined8 *)((long)&setupDefaultUniforms::s_boolUniforms[0].name + lVar3))
    ;
    if (iVar1 != -1) {
      (**(code **)(lVar2 + 0x14f0))(iVar1,(&setupDefaultUniforms::s_boolUniforms[0].value)[lVar3]);
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 == 0x10);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_bvec4Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar3 = 0;
  do {
    local_38 = (uint)setupDefaultUniforms::s_bvec4Uniforms[0].value.m_data[lVar3];
    local_34 = (uint)setupDefaultUniforms::s_bvec4Uniforms[0].value.m_data[lVar3 + 1];
    local_30 = (uint)setupDefaultUniforms::s_bvec4Uniforms[0].value.m_data[lVar3 + 2];
    local_2c = (uint)setupDefaultUniforms::s_bvec4Uniforms[0].value.m_data[lVar3 + 3];
    iVar1 = (**(code **)(lVar2 + 0xb48))
                      (programID,
                       *(undefined8 *)
                        ((long)&((BVec4Uniform *)
                                (&setupDefaultUniforms::s_bvec4Uniforms[0].value + -2))->name +
                        lVar3));
    if (iVar1 != -1) {
      (**(code **)(lVar2 + 0x15b8))(iVar1,1,&local_38);
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 == 0x10);
  lVar3 = 8;
  do {
    iVar1 = (**(code **)(lVar2 + 0xb48))
                      (programID,
                       *(undefined8 *)(&setupDefaultUniforms::s_boolUniforms[1].value + lVar3));
    if (iVar1 != -1) {
      (**(code **)(lVar2 + 0x14f0))
                (iVar1,*(undefined4 *)((long)&setupDefaultUniforms::s_intUniforms[0].name + lVar3));
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0xb8);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_ivec2Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar3 = 0;
  do {
    iVar1 = (**(code **)(lVar2 + 0xb48))
                      (programID,
                       *(undefined8 *)
                        ((long)&((IVec2Uniform *)
                                (&setupDefaultUniforms::s_ivec2Uniforms[0].value + -1))->name +
                        lVar3));
    if (iVar1 != -1) {
      (**(code **)(lVar2 + 0x1538))(iVar1,1,lVar3 + 0x22b2518);
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x60);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_ivec3Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar3 = 0;
  do {
    iVar1 = (**(code **)(lVar2 + 0xb48))
                      (programID,
                       *(undefined8 *)
                        ((long)setupDefaultUniforms::s_ivec3Uniforms[0].value.m_data + lVar3 + -8));
    if (iVar1 != -1) {
      (**(code **)(lVar2 + 0x1578))(iVar1,1,lVar3 + 0x22b2588);
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x90);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_ivec4Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar3 = 0;
  do {
    iVar1 = (**(code **)(lVar2 + 0xb48))
                      (programID,
                       *(undefined8 *)
                        ((long)setupDefaultUniforms::s_ivec4Uniforms[0].value.m_data + lVar3 + -8));
    if (iVar1 != -1) {
      (**(code **)(lVar2 + 0x15b8))(iVar1,1,lVar3 + 0x22b2628);
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x90);
  lVar3 = 0;
  do {
    iVar1 = (**(code **)(lVar2 + 0xb48))
                      (programID,
                       *(undefined8 *)((long)&setupDefaultUniforms::s_floatUniforms[0].name + lVar3)
                      );
    if (iVar1 != -1) {
      (**(code **)(lVar2 + 0x14e0))
                (*(undefined4 *)((long)&setupDefaultUniforms::s_floatUniforms[0].value + lVar3),
                 iVar1);
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x100);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_vec2Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar3 = 0;
  do {
    iVar1 = (**(code **)(lVar2 + 0xb48))
                      (programID,
                       *(undefined8 *)
                        ((long)&((Vec2Uniform *)
                                (&setupDefaultUniforms::s_vec2Uniforms[0].value + -1))->name + lVar3
                        ));
    if (iVar1 != -1) {
      (**(code **)(lVar2 + 0x1528))(iVar1,1,lVar3 + 0x22b26c8);
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x50);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_vec3Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar3 = 0;
  do {
    iVar1 = (**(code **)(lVar2 + 0xb48))
                      (programID,
                       *(undefined8 *)
                        ((long)setupDefaultUniforms::s_vec3Uniforms[0].value.m_data + lVar3 + -8));
    if (iVar1 != -1) {
      (**(code **)(lVar2 + 0x1568))(iVar1,1,lVar3 + 0x22b2728);
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x78);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_vec4Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar3 = 0;
  do {
    iVar1 = (**(code **)(lVar2 + 0xb48))
                      (programID,
                       *(undefined8 *)
                        ((long)setupDefaultUniforms::s_vec4Uniforms[0].value.m_data + lVar3 + -8));
    if (iVar1 != -1) {
      (**(code **)(lVar2 + 0x15a8))(iVar1,1,lVar3 + 0x22b27a8);
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0xc0);
  return;
}

Assistant:

void setupDefaultUniforms (const glu::RenderContext& context, deUint32 programID)
{
	const glw::Functions& gl = context.getFunctions();

	// Bool.
	struct BoolUniform { const char* name; bool value; };
	static const BoolUniform s_boolUniforms[] =
	{
		{ "ub_true",	true },
		{ "ub_false",	false },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_boolUniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_boolUniforms[i].name);
		if (uniLoc != -1)
			gl.uniform1i(uniLoc, s_boolUniforms[i].value);
	}

	// BVec4.
	struct BVec4Uniform { const char* name; BVec4 value; };
	static const BVec4Uniform s_bvec4Uniforms[] =
	{
		{ "ub4_true",	BVec4(true) },
		{ "ub4_false",	BVec4(false) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_bvec4Uniforms); i++)
	{
		const BVec4Uniform& uni = s_bvec4Uniforms[i];
		int arr[4];
		arr[0] = (int)uni.value.x();
		arr[1] = (int)uni.value.y();
		arr[2] = (int)uni.value.z();
		arr[3] = (int)uni.value.w();
		int uniLoc = gl.getUniformLocation(programID, uni.name);
		if (uniLoc != -1)
			gl.uniform4iv(uniLoc, 1, &arr[0]);
	}

	// Int.
	struct IntUniform { const char* name; int value; };
	static const IntUniform s_intUniforms[] =
	{
		{ "ui_minusOne",		-1 },
		{ "ui_zero",			0 },
		{ "ui_one",				1 },
		{ "ui_two",				2 },
		{ "ui_three",			3 },
		{ "ui_four",			4 },
		{ "ui_five",			5 },
		{ "ui_six",				6 },
		{ "ui_seven",			7 },
		{ "ui_eight",			8 },
		{ "ui_oneHundredOne",	101 }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_intUniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_intUniforms[i].name);
		if (uniLoc != -1)
			gl.uniform1i(uniLoc, s_intUniforms[i].value);
	}

	// IVec2.
	struct IVec2Uniform { const char* name; IVec2 value; };
	static const IVec2Uniform s_ivec2Uniforms[] =
	{
		{ "ui2_minusOne",	IVec2(-1) },
		{ "ui2_zero",		IVec2(0) },
		{ "ui2_one",		IVec2(1) },
		{ "ui2_two",		IVec2(2) },
		{ "ui2_four",		IVec2(4) },
		{ "ui2_five",		IVec2(5) }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_ivec2Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_ivec2Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform2iv(uniLoc, 1, s_ivec2Uniforms[i].value.getPtr());
	}

	// IVec3.
	struct IVec3Uniform { const char* name; IVec3 value; };
	static const IVec3Uniform s_ivec3Uniforms[] =
	{
		{ "ui3_minusOne",	IVec3(-1) },
		{ "ui3_zero",		IVec3(0) },
		{ "ui3_one",		IVec3(1) },
		{ "ui3_two",		IVec3(2) },
		{ "ui3_four",		IVec3(4) },
		{ "ui3_five",		IVec3(5) }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_ivec3Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_ivec3Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform3iv(uniLoc, 1, s_ivec3Uniforms[i].value.getPtr());
	}

	// IVec4.
	struct IVec4Uniform { const char* name; IVec4 value; };
	static const IVec4Uniform s_ivec4Uniforms[] =
	{
		{ "ui4_minusOne",	IVec4(-1) },
		{ "ui4_zero",		IVec4(0) },
		{ "ui4_one",		IVec4(1) },
		{ "ui4_two",		IVec4(2) },
		{ "ui4_four",		IVec4(4) },
		{ "ui4_five",		IVec4(5) }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_ivec4Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_ivec4Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform4iv(uniLoc, 1, s_ivec4Uniforms[i].value.getPtr());
	}

	// Float.
	struct FloatUniform { const char* name; float value; };
	static const FloatUniform s_floatUniforms[] =
	{
		{ "uf_zero",	0.0f },
		{ "uf_one",		1.0f },
		{ "uf_two",		2.0f },
		{ "uf_three",	3.0f },
		{ "uf_four",	4.0f },
		{ "uf_five",	5.0f },
		{ "uf_six",		6.0f },
		{ "uf_seven",	7.0f },
		{ "uf_eight",	8.0f },
		{ "uf_half",	1.0f / 2.0f },
		{ "uf_third",	1.0f / 3.0f },
		{ "uf_fourth",	1.0f / 4.0f },
		{ "uf_fifth",	1.0f / 5.0f },
		{ "uf_sixth",	1.0f / 6.0f },
		{ "uf_seventh",	1.0f / 7.0f },
		{ "uf_eighth",	1.0f / 8.0f }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_floatUniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_floatUniforms[i].name);
		if (uniLoc != -1)
			gl.uniform1f(uniLoc, s_floatUniforms[i].value);
	}

	// Vec2.
	struct Vec2Uniform { const char* name; Vec2 value; };
	static const Vec2Uniform s_vec2Uniforms[] =
	{
		{ "uv2_minusOne",	Vec2(-1.0f) },
		{ "uv2_zero",		Vec2(0.0f) },
		{ "uv2_half",		Vec2(0.5f) },
		{ "uv2_one",		Vec2(1.0f) },
		{ "uv2_two",		Vec2(2.0f) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_vec2Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_vec2Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform2fv(uniLoc, 1, s_vec2Uniforms[i].value.getPtr());
	}

	// Vec3.
	struct Vec3Uniform { const char* name; Vec3 value; };
	static const Vec3Uniform s_vec3Uniforms[] =
	{
		{ "uv3_minusOne",	Vec3(-1.0f) },
		{ "uv3_zero",		Vec3(0.0f) },
		{ "uv3_half",		Vec3(0.5f) },
		{ "uv3_one",		Vec3(1.0f) },
		{ "uv3_two",		Vec3(2.0f) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_vec3Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_vec3Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform3fv(uniLoc, 1, s_vec3Uniforms[i].value.getPtr());
	}

	// Vec4.
	struct Vec4Uniform { const char* name; Vec4 value; };
	static const Vec4Uniform s_vec4Uniforms[] =
	{
		{ "uv4_minusOne",	Vec4(-1.0f) },
		{ "uv4_zero",		Vec4(0.0f) },
		{ "uv4_half",		Vec4(0.5f) },
		{ "uv4_one",		Vec4(1.0f) },
		{ "uv4_two",		Vec4(2.0f) },
		{ "uv4_black",		Vec4(0.0f, 0.0f, 0.0f, 1.0f) },
		{ "uv4_gray",		Vec4(0.5f, 0.5f, 0.5f, 1.0f) },
		{ "uv4_white",		Vec4(1.0f, 1.0f, 1.0f, 1.0f) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_vec4Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_vec4Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform4fv(uniLoc, 1, s_vec4Uniforms[i].value.getPtr());
	}
}